

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O0

compile_errcode __thiscall VariableDefinition::Generate(VariableDefinition *this)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  int character_number;
  int line_number;
  SymbolName name;
  int state;
  VariableDefinition *this_local;
  
  line_number = 0;
  _name = this;
  do {
    character_number = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_24 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_28 = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(line_number) {
    case 0:
      bVar1 = IsValidVariableType(character_number);
      if (!bVar1) {
        return -1;
      }
      line_number = 1;
      this->m_type = character_number;
      break;
    case 1:
      if (character_number != 0x22) {
        return -1;
      }
      line_number = 2;
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_48,handle_correct_queue);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      bVar1 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
      if (bVar1) {
        this->m_valid = false;
      }
      else {
        this->m_valid = true;
      }
      break;
    case 2:
      if (character_number == 0x1b) {
        line_number = 0xb;
      }
      else if (character_number == 0x17) {
        line_number = 1;
      }
      else {
        if (character_number != 0x18) {
          return -1;
        }
        line_number = 3;
      }
      break;
    case 3:
      return 0;
    case 0xb:
      if (character_number != 0x25) {
        return -1;
      }
      line_number = 0xc;
      iVar2 = SymbolQueue::GetCurrentValue<int>(handle_correct_queue);
      this->m_array_length = iVar2;
      if (this->m_array_length < 1) {
        this->m_valid = false;
      }
      break;
    case 0xc:
      if (character_number != 0x1e) {
        return -1;
      }
      line_number = 0xd;
      break;
    case 0xd:
      if (character_number == 0x17) {
        line_number = 1;
      }
      else {
        if (character_number != 0x18) {
          return -1;
        }
        line_number = 3;
      }
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Generate() {
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        m_valid = false;
                    } else {
                        m_valid = true;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    m_array_length = handle_correct_queue->GetCurrentValue<int>();
                    if (m_array_length <= 0) {
                        m_valid = false;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}